

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

void __thiscall mjs::interpreter::impl::scope::fixup(scope *this)

{
  if ((this->activation_).pos_ != 0) {
    gc_heap::register_fixup(this->heap_,&(this->activation_).pos_);
  }
  if ((this->prev_).pos_ != 0) {
    gc_heap::register_fixup(this->heap_,&(this->prev_).pos_);
  }
  if ((this->active_functions_).pos_ != 0) {
    gc_heap::register_fixup(this->heap_,&(this->active_functions_).pos_);
  }
  if ((this->active_function_values_).pos_ != 0) {
    gc_heap::register_fixup(this->heap_,&(this->active_function_values_).pos_);
    return;
  }
  return;
}

Assistant:

void fixup() {
            activation_.fixup(heap_);
            prev_.fixup(heap_);
            active_functions_.fixup(heap_);
            active_function_values_.fixup(heap_);
        }